

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O1

void __thiscall
BSA_SpikeDecodingSynapse::initialize
          (BSA_SpikeDecodingSynapse *this,Population *n_from,Population *n_to)

{
  WindowType WVar1;
  iterator iVar2;
  int iVar3;
  Clock *pCVar4;
  Logging *pLVar5;
  _Map_pointer ppdVar6;
  ulong uVar7;
  BSA_SpikeDecodingSynapse_param *pBVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  double *pdVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  allocator_type local_99;
  double local_98;
  double local_90;
  value_type_conflict3 local_88;
  _Deque_base<double,_std::allocator<double>_> local_80;
  
  iVar3 = (*n_from->_vptr_Population[3])(n_from);
  this->inputSize = iVar3;
  iVar3 = (*n_to->_vptr_Population[1])(n_to);
  this->outputSize = iVar3;
  if (this->inputSize != iVar3) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "Number of input neurons not equal to number of output neurons");
    std::endl<char,std::char_traits<char>>(poVar9);
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = "Number of input neurons not equal to number of output neurons";
    __cxa_throw(puVar10,&char_const*::typeinfo,0);
  }
  (this->super_Synapse).from_population = n_from;
  (this->super_Synapse).to_population = n_to;
  pCVar4 = Clock::getInstance();
  this->clock = pCVar4;
  pLVar5 = Logging::getInstance();
  this->logger = pLVar5;
  if (0 < this->inputSize) {
    iVar3 = 0;
    do {
      ppdVar6 = (_Map_pointer)operator_new(0x20);
      *ppdVar6 = (double *)&PTR_setWeight_00126bc8;
      ppdVar6[3] = (double *)0x0;
      *(undefined4 *)(ppdVar6 + 1) = 3;
      pCVar4 = Clock::getInstance();
      pdVar15 = (double *)Clock::getCurrentTime(pCVar4);
      ppdVar6[2] = pdVar15;
      local_80._M_impl.super__Deque_impl_data._M_map = ppdVar6;
      std::vector<Event*,std::allocator<Event*>>::emplace_back<Event*>
                ((vector<Event*,std::allocator<Event*>> *)&this->output,(Event **)&local_80);
      iVar14 = this->inputSize;
      dVar16 = this->param->filter_length;
      uVar7 = (ulong)dVar16;
      local_88 = 0.0;
      std::deque<double,_std::allocator<double>_>::deque
                ((deque<double,_std::allocator<double>_> *)&local_80,
                 (long)(dVar16 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7,&local_88,
                 &local_99);
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::_M_fill_assign(&this->input,(long)iVar14,(value_type *)&local_80);
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_80);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->inputSize);
  }
  WVar1 = this->param->window;
  if (WVar1 == TRIANGLE) {
    local_90 = this->param->filter_length;
    dVar16 = ceil(local_90 * 0.5);
    iVar3 = (int)dVar16;
    uVar13 = (uint)local_90;
    dVar16 = (double)iVar3;
    local_98 = dVar16;
    if (0 < iVar3) {
      dVar18 = 1.0;
      iVar14 = iVar3;
      do {
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((dVar18 / dVar16) * this->param->scale);
        iVar2._M_current =
             (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_90 = dVar18;
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->filter,iVar2,(double *)&local_80);
          dVar16 = local_98;
          dVar18 = local_90;
        }
        else {
          *iVar2._M_current = (double)local_80._M_impl.super__Deque_impl_data._M_map;
          (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        dVar18 = dVar18 + 1.0;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    if ((uVar13 & 1) == 0) {
      iVar2._M_current =
           (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->filter,iVar2,
                   iVar2._M_current + -1);
        dVar16 = local_98;
      }
      else {
        *iVar2._M_current = iVar2._M_current[-1];
        (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
    if (1 < iVar3) {
      iVar3 = iVar3 + 1;
      do {
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)(((double)(iVar3 + -2) / dVar16) * this->param->scale);
        iVar2._M_current =
             (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->filter,iVar2,(double *)&local_80);
          dVar16 = local_98;
        }
        else {
          *iVar2._M_current = (double)local_80._M_impl.super__Deque_impl_data._M_map;
          (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar3 = iVar3 + -1;
      } while (2 < iVar3);
    }
  }
  else if (WVar1 == HAMMING) {
    pBVar8 = this->param;
    dVar16 = 0.0;
    if (0.0 < pBVar8->filter_length) {
      iVar3 = 1;
      do {
        dVar16 = cos((dVar16 * 6.283185307179586) / (pBVar8->filter_length + -1.0));
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((dVar16 * -0.46 + 0.54) * this->param->scale);
        iVar2._M_current =
             (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->filter,iVar2,(double *)&local_80);
        }
        else {
          *iVar2._M_current = (double)local_80._M_impl.super__Deque_impl_data._M_map;
          (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        dVar16 = (double)iVar3;
        pBVar8 = this->param;
        iVar3 = iVar3 + 1;
      } while (dVar16 < pBVar8->filter_length);
    }
  }
  lVar11 = (long)(this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar12 = lVar11 >> 3;
  auVar17._8_4_ = (int)(lVar11 >> 0x23);
  auVar17._0_8_ = lVar12;
  auVar17._12_4_ = 0x45300000;
  dVar18 = (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
  dVar16 = this->param->filter_length;
  if ((dVar16 != dVar18) || (NAN(dVar16) || NAN(dVar18))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "BSA_SpikeEncodingSynapse: filter length does not matched the generated filter",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  return;
}

Assistant:

void BSA_SpikeDecodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfOutputNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new ValueEvent());
        input.assign(inputSize, deque<double>(param->filter_length, 0));
    }

    if(param->window == HAMMING) {
        for(int i = 0; i < param->filter_length; i++) {
            filter.push_back((0.54 - 0.46 * cos(6.283185307179586*i/(param->filter_length-1))) * param->scale);
        }
    }
    else if(param->window == TRIANGLE) {
        int middle = ceil(param->filter_length/2.0);
        int len = param->filter_length;
        bool isEven = len % 2 == 0;
        for(int i = 1; i <= middle; i++) {
            filter.push_back((i) / (double)middle * param->scale);
        }
        if(isEven) {
            filter.push_back(filter.back());
        }
        for(int i = middle; i > 1; i--) {
            filter.push_back((i-1) / (double)middle * param->scale);
        }
    }
    if(filter.size() != param->filter_length) {
        cout << "BSA_SpikeEncodingSynapse: filter length does not matched the generated filter" << endl;
    }
    // filter = vector<double>{0.05942473828591342,0.07318223830709897,0.11232230333947553,0.17484795255681723,0.25675440297792484,0.3523237031416342,0.454573094246691,0.5558198517560227,0.6483143637949771,0.724886509451,0.7795486730754763,0.8080021690669681,0.8080021690669681,0.7795486730754763,0.724886509451,0.6483143637949771,0.5558198517560227,0.45457309424669107,0.3523237031416343,0.256754402977925,0.17484795255681737,0.11232230333947553,0.07318223830709897,0.05942473828591342};
    // filter = vector<double>{0.0,0.030303030303030304,0.06060606060606061,0.0909090909090909,0.12121212121212122,0.15151515151515152,0.1818181818181818,0.21212121212121213,0.24242424242424243,0.27272727272727276,0.30303030303030304,0.27272727272727276,0.24242424242424243,0.21212121212121213,0.1818181818181818,0.15151515151515152,0.12121212121212122,0.0909090909090909,0.06060606060606061,0.030303030303030304,0.0};
    for(int i = 0; i < param->filter_length; i++) {
        // TODO add
        // filter.push_back(0.5);
    }
}